

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O3

void __thiscall
curlpp::OptionTrait<std::basic_ostream<char,_std::char_traits<char>_>_*,_(CURLoption)10001>::
~OptionTrait(OptionTrait<std::basic_ostream<char,_std::char_traits<char>_>_*,_(CURLoption)10001>
             *this)

{
  (this->super_Option<std::basic_ostream<char,_std::char_traits<char>_>_*>).super_OptionBase.
  _vptr_OptionBase = (_func_int **)&PTR__Option_001338d8;
  operator_delete((this->super_Option<std::basic_ostream<char,_std::char_traits<char>_>_*>).
                  mContainer);
  (this->super_Option<std::basic_ostream<char,_std::char_traits<char>_>_*>).mContainer =
       (OptionContainer<std::basic_ostream<char,_std::char_traits<char>_>_*> *)0x0;
  OptionBase::~OptionBase((OptionBase *)this);
  operator_delete(this);
  return;
}

Assistant:

class CURLPPAPI OptionTrait : public Option<OptionType>
	{
		
		friend class Easy;

	public:

		static const CURLoption option = opt;

		/**
		* The constructor takes the a value to set a handle.
		*/
		OptionTrait(typename Option<OptionType>::ParamType value);

		/**
		* The constructor will contain an unset option value.
		* Note that if you try to retreive the value of this option
		* before calling the curlpp::Option::setValue function it will
		* throw a UnsetOption exception.
		*/
		OptionTrait();

		/**
		* Return a copy of the current option. 
		* Note that the option value is copied too.
		*/
		virtual OptionTrait * clone() const;

	private:

		/**
		* will call the actual libcurl option function with the value we got 
		* on the handle.
		*/
		virtual void updateHandleToMe(internal::CurlHandle * handle) const;

	}